

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int mbedtls_ssl_handle_pending_alert(mbedtls_ssl_context *ssl)

{
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->send_alert == '\0') {
    ssl_local._4_4_ = 0;
  }
  else {
    ssl_local._4_4_ = mbedtls_ssl_send_alert_message(ssl,'\x02',ssl->alert_type);
    if (ssl_local._4_4_ != -0x6880) {
      ssl->send_alert = '\0';
    }
    if (ssl_local._4_4_ == 0) {
      ssl_local._4_4_ = ssl->alert_reason;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_handle_pending_alert(mbedtls_ssl_context *ssl)
{
    int ret;

    /* No pending alert, return success*/
    if (ssl->send_alert == 0) {
        return 0;
    }

    ret = mbedtls_ssl_send_alert_message(ssl,
                                         MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                         ssl->alert_type);

    /* If mbedtls_ssl_send_alert_message() returned with MBEDTLS_ERR_SSL_WANT_WRITE,
     * do not clear the alert to be able to send it later.
     */
    if (ret != MBEDTLS_ERR_SSL_WANT_WRITE) {
        ssl->send_alert = 0;
    }

    if (ret != 0) {
        return ret;
    }

    return ssl->alert_reason;
}